

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O0

void __thiscall
YAML::GraphBuilderAdapter::OnNull(GraphBuilderAdapter *this,Mark *mark,anchor_t anchor)

{
  GraphBuilderAdapter *this_00;
  void *pNode_00;
  undefined8 in_RSI;
  void *in_RDI;
  void *pNode;
  void *pParent;
  GraphBuilderAdapter *in_stack_ffffffffffffffc8;
  
  this_00 = (GraphBuilderAdapter *)GetCurrentParent(in_stack_ffffffffffffffc8);
  pNode_00 = (void *)(**(code **)(**(long **)((long)in_RDI + 8) + 0x10))
                               (*(long **)((long)in_RDI + 8),in_RSI,this_00);
  RegisterAnchor(this_00,(anchor_t)pNode_00,in_RDI);
  DispositionNode(this_00,pNode_00);
  return;
}

Assistant:

void GraphBuilderAdapter::OnNull(const Mark &mark, anchor_t anchor) {
  void *pParent = GetCurrentParent();
  void *pNode = m_builder.NewNull(mark, pParent);
  RegisterAnchor(anchor, pNode);

  DispositionNode(pNode);
}